

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::IsMember::IsMember<char_const*>(IsMember *this,initializer_list<const_char_*> values)

{
  initializer_list<const_char_*> __l;
  allocator<const_char_*> local_49;
  IsMember *local_48;
  iterator ppcStack_40;
  vector<const_char_*,_std::allocator<const_char_*>_> local_38;
  IsMember *local_20;
  IsMember *this_local;
  initializer_list<const_char_*> values_local;
  
  ppcStack_40 = (iterator)values._M_len;
  local_48 = (IsMember *)values._M_array;
  local_20 = this;
  this_local = local_48;
  values_local._M_array = ppcStack_40;
  _GLOBAL__N_1::std::allocator<const_char_*>::allocator(&local_49);
  __l._M_len = (size_type)ppcStack_40;
  __l._M_array = (iterator)local_48;
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_38,__l,&local_49);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>>(this,&local_38);
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_38);
  _GLOBAL__N_1::std::allocator<const_char_*>::~allocator(&local_49);
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}